

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.hpp
# Opt level: O2

void __thiscall
crsGA::
Population<crsGA::Chromosome<Gen,ComputeFitness>,PopulationInitializationPolicy<crsGA::Chromosome<Gen,ComputeFitness>>>
::
parallelCalculateFitness<__gnu_cxx::__normal_iterator<crsGA::Chromosome<Gen,ComputeFitness>*,std::vector<crsGA::Chromosome<Gen,ComputeFitness>,std::allocator<crsGA::Chromosome<Gen,ComputeFitness>>>>>
          (Population<crsGA::Chromosome<Gen,ComputeFitness>,PopulationInitializationPolicy<crsGA::Chromosome<Gen,ComputeFitness>>>
           *this,__normal_iterator<crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
                 first,
          __normal_iterator<crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
          last,UserData *data)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  __normal_iterator<crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
  __stat_loc;
  ulong uVar4;
  uint uVar5;
  Chromosome<Gen,_ComputeFitness> *local_90;
  __normal_iterator<crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
  blockStart;
  UserData *data_local;
  __normal_iterator<crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
  local_70;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> futures;
  Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  *local_50;
  undefined8 local_48;
  
  uVar1 = ((long)last._M_current - (long)first._M_current) / 0x28;
  if ((long)uVar1 < (long)(ulong)*(uint *)(this + 0xf0)) {
    Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
    ::calculateFitnessBlock
              ((Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
                *)this,(iterator)first._M_current,(iterator)last._M_current,data);
  }
  uVar2 = *(long *)(this + 0xe0) - *(long *)(this + 0xd8) >> 3;
  futures.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  futures.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  futures.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = uVar2 - 1;
  blockStart._M_current = first._M_current;
  for (uVar4 = 0; uVar4 < uVar3; uVar4 = (ulong)((int)uVar4 + 1)) {
    local_90 = blockStart._M_current + uVar1 / uVar2;
    local_50 = (Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
                *)Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
                  ::calculateFitnessBlock;
    local_48 = 0;
    local_70._M_current = (Chromosome<Gen,_ComputeFitness> *)this;
    ThreadPool::
    enqueue<void(crsGA::Population<crsGA::Chromosome<Gen,ComputeFitness>,PopulationInitializationPolicy<crsGA::Chromosome<Gen,ComputeFitness>>>::*)(__gnu_cxx::__normal_iterator<crsGA::Chromosome<Gen,ComputeFitness>*,std::vector<crsGA::Chromosome<Gen,ComputeFitness>,std::allocator<crsGA::Chromosome<Gen,ComputeFitness>>>>,__gnu_cxx::__normal_iterator<crsGA::Chromosome<Gen,ComputeFitness>*,std::vector<crsGA::Chromosome<Gen,ComputeFitness>,std::allocator<crsGA::Chromosome<Gen,ComputeFitness>>>>,crsGA::UserData_const*),crsGA::Population<crsGA::Chromosome<Gen,ComputeFitness>,PopulationInitializationPolicy<crsGA::Chromosome<Gen,ComputeFitness>>>*,__gnu_cxx::__normal_iterator<crsGA::Chromosome<Gen,ComputeFitness>*,std::vector<crsGA::Chromosome<Gen,ComputeFitness>,std::allocator<crsGA::Chromosome<Gen,ComputeFitness>>>>&,__gnu_cxx::__normal_iterator<crsGA::Chromosome<Gen,ComputeFitness>*,std::vector<crsGA::Chromosome<Gen,ComputeFitness>,std::allocator<crsGA::Chromosome<Gen,ComputeFitness>>>>&,crsGA::UserData_const*&>
              ((ThreadPool *)&stack0xffffffffffffffc0,
               (offset_in_Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_to_subr
                *)(this + 0x20),&local_50,&local_70,&blockStart,(UserData **)&local_90);
    std::vector<std::future<void>,std::allocator<std::future<void>>>::
    emplace_back<std::future<void>>
              ((vector<std::future<void>,std::allocator<std::future<void>>> *)&futures,
               (future<void> *)&stack0xffffffffffffffc0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
    blockStart._M_current = local_90;
  }
  __stat_loc._M_current = blockStart._M_current;
  Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ::calculateFitnessBlock
            ((Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
              *)this,(iterator)blockStart._M_current,(iterator)last._M_current,data);
  for (uVar5 = 0; uVar5 < uVar3; uVar5 = uVar5 + 1) {
    std::__basic_future<void>::wait
              (&futures.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar5].super___basic_future<void>,
               __stat_loc._M_current);
  }
  std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector(&futures);
  return;
}

Assistant:

void parallelCalculateFitness(Iterator first, Iterator last, const UserData *data)
    {
        auto length = std::distance(first, last);
        if (length < _minPerThread)
            calculateFitnessBlock(first, last, data);
        const auto numThreads = _threadPool.getNumThreads();
        const size_t blockSize = length / numThreads;

        std::vector<std::future<void>> futures;
        Iterator blockStart = first;
        for (auto i = 0u; i < (numThreads - 1); ++i)
        {
            Iterator blockEnd = blockStart;
            std::advance(blockEnd, blockSize);
            futures.emplace_back(_threadPool.enqueue(&Population::calculateFitnessBlock, this, blockStart, blockEnd, data));
            blockStart = blockEnd;
        }
        calculateFitnessBlock(blockStart, last, data);
        for (auto i = 0u; i < (numThreads - 1); ++i)
        {
            futures[i].wait();
        }
    }